

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr_io.cpp
# Opt level: O2

void LoadEXR_RGBA(float **rgba,int *width,int *height,char *filename)

{
  char *pcVar1;
  int iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  char *err;
  
  err = (char *)0x0;
  iVar2 = LoadEXR(rgba,width,height,filename,&err);
  pcVar1 = err;
  if (iVar2 != 0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = err;
    if (pcVar1 == (char *)0x0) {
      pcVar4 = "LoadEXR unknown error";
    }
    *puVar3 = pcVar4;
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  return;
}

Assistant:

void LoadEXR_RGBA(float** rgba, int* width, int* height, const char* filename)
{
  const char* err = NULL;
  int ret = LoadEXR(rgba, width, height, filename, &err);
  if (ret != TINYEXR_SUCCESS) {
    if (err) {
      throw err;
    }
    else {
      throw "LoadEXR unknown error";
    }
  }
}